

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateLibraryIncludes
          (FileGenerator *this,Printer *printer)

{
  FileDescriptor *pFVar1;
  pointer pcVar2;
  bool bVar3;
  FileOptions_OptimizeMode FVar4;
  LogMessage *pLVar5;
  long lVar6;
  Options *options;
  long lVar7;
  bool v;
  Formatter format;
  LogMessage local_b0;
  uint local_74;
  Options *local_70;
  Formatter local_68;
  
  local_68.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_68.vars_._M_t,&(this->variables_)._M_t);
  options = &this->options_;
  bVar3 = UsingImplicitWeakFields(this->file_,options);
  pcVar2 = (pointer)((long)&local_b0 + 0x10);
  if (bVar3) {
    local_b0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"net/proto2/public/implicit_weak_message.h","");
    DoIncludeFile(this,(string *)&local_b0,false,printer);
    if ((pointer)local_b0._0_8_ != pcVar2) {
      operator_delete((void *)local_b0._0_8_);
    }
  }
  bVar3 = HasWeakFields(this->file_,options);
  if (bVar3) {
    if ((this->options_).opensource_runtime == true) {
      internal::LogMessage::LogMessage
                (&local_b0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_file.cc"
                 ,0x478);
      pLVar5 = internal::LogMessage::operator<<
                         (&local_b0,"CHECK failed: !options_.opensource_runtime: ");
      internal::LogFinisher::operator=((LogFinisher *)&local_74,pLVar5);
      internal::LogMessage::~LogMessage(&local_b0);
    }
    local_b0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"net/proto2/public/weak_field_map.h","");
    DoIncludeFile(this,(string *)&local_b0,false,printer);
    if ((pointer)local_b0._0_8_ != pcVar2) {
      operator_delete((void *)local_b0._0_8_);
    }
  }
  bVar3 = HasLazyFields(this->file_,options,&this->scc_analyzer_);
  if (bVar3) {
    if ((this->options_).opensource_runtime == true) {
      internal::LogMessage::LogMessage
                (&local_b0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_file.cc"
                 ,0x47c);
      pLVar5 = internal::LogMessage::operator<<
                         (&local_b0,"CHECK failed: !options_.opensource_runtime: ");
      internal::LogFinisher::operator=((LogFinisher *)&local_74,pLVar5);
      internal::LogMessage::~LogMessage(&local_b0);
    }
    local_b0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"net/proto2/public/lazy_field.h","");
    DoIncludeFile(this,(string *)&local_b0,false,printer);
    if ((pointer)local_b0._0_8_ != pcVar2) {
      operator_delete((void *)local_b0._0_8_);
    }
  }
  bVar3 = ShouldVerify(this->file_,options,&this->scc_analyzer_);
  if (bVar3) {
    local_b0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"net/proto2/public/wire_format_verify.h","");
    DoIncludeFile(this,(string *)&local_b0,false,printer);
    if ((pointer)local_b0._0_8_ != pcVar2) {
      operator_delete((void *)local_b0._0_8_);
    }
  }
  if ((this->options_).opensource_runtime == true) {
    local_b0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"net/proto2/public/port_def.inc","");
    DoIncludeFile(this,(string *)&local_b0,false,printer);
    if ((pointer)local_b0._0_8_ != pcVar2) {
      operator_delete((void *)local_b0._0_8_);
    }
    local_b0.level_ = 0x2e10f8;
    local_74 = 0x2e10f8;
    Formatter::operator()
              (&local_68,
               "#if PROTOBUF_VERSION < $1$\n#error This file was generated by a newer version of protoc which is\n#error incompatible with your Protocol Buffer headers. Please update\n#error your headers.\n#endif\n#if $2$ < PROTOBUF_MIN_PROTOC_VERSION\n#error This file was generated by an older version of protoc which is\n#error incompatible with your Protocol Buffer headers. Please\n#error regenerate this file with a newer version of protoc.\n#endif\n\n"
               ,(int *)&local_b0,(int *)&local_74);
    local_b0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"net/proto2/public/port_undef.inc","");
    DoIncludeFile(this,(string *)&local_b0,false,printer);
    if ((pointer)local_b0._0_8_ != pcVar2) {
      operator_delete((void *)local_b0._0_8_);
    }
  }
  local_b0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"net/proto2/io/public/coded_stream.h","");
  DoIncludeFile(this,(string *)&local_b0,false,printer);
  if ((pointer)local_b0._0_8_ != pcVar2) {
    operator_delete((void *)local_b0._0_8_);
  }
  local_b0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"net/proto2/public/arena.h","");
  DoIncludeFile(this,(string *)&local_b0,false,printer);
  if ((pointer)local_b0._0_8_ != pcVar2) {
    operator_delete((void *)local_b0._0_8_);
  }
  local_b0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"net/proto2/public/arenastring.h","");
  DoIncludeFile(this,(string *)&local_b0,false,printer);
  if ((pointer)local_b0._0_8_ != pcVar2) {
    operator_delete((void *)local_b0._0_8_);
  }
  if ((((this->options_).force_inline_string != false) ||
      ((this->options_).profile_driven_inline_string == true)) &&
     ((this->options_).opensource_runtime == false)) {
    local_b0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"net/proto2/public/inlined_string_field.h","");
    DoIncludeFile(this,(string *)&local_b0,false,printer);
    if ((pointer)local_b0._0_8_ != pcVar2) {
      operator_delete((void *)local_b0._0_8_);
    }
  }
  pFVar1 = this->file_;
  local_b0._0_8_ = &local_74;
  local_74 = local_74 & 0xffffff00;
  local_b0.filename_ = (char *)options;
  if (0 < *(int *)(pFVar1 + 0x2c)) {
    lVar7 = 0;
    lVar6 = 0;
    local_70 = options;
    do {
      ForEachMessage<google::protobuf::compiler::cpp::HasSimpleBaseClasses(google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::Options_const&)::_lambda(google::protobuf::Descriptor_const*)_1_>
                ((Descriptor *)(*(long *)(pFVar1 + 0x58) + lVar7),
                 (anon_class_16_2_1ad39c11 *)&local_b0);
      options = local_70;
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0x88;
    } while (lVar6 < *(int *)(pFVar1 + 0x2c));
    if ((local_74 & 1) != 0) {
      local_b0._0_8_ = (pointer)((long)&local_b0 + 0x10U);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"net/proto2/public/generated_message_bases.h","");
      DoIncludeFile(this,(string *)&local_b0,false,printer);
      if ((pointer)local_b0._0_8_ != (pointer)((long)&local_b0 + 0x10U)) {
        operator_delete((void *)local_b0._0_8_);
      }
    }
  }
  pcVar2 = (pointer)((long)&local_b0 + 0x10);
  local_b0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"net/proto2/public/generated_message_table_driven.h","");
  DoIncludeFile(this,(string *)&local_b0,false,printer);
  if ((pointer)local_b0._0_8_ != pcVar2) {
    operator_delete((void *)local_b0._0_8_);
  }
  FVar4 = GetOptimizeFor(this->file_,options,(bool *)0x0);
  if ((FVar4 != FileOptions_OptimizeMode_CODE_SIZE) &&
     ((this->options_).tctable_mode != kTCTableNever)) {
    local_b0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"net/proto2/public/generated_message_tctable_decl.h","");
    DoIncludeFile(this,(string *)&local_b0,false,printer);
    if ((pointer)local_b0._0_8_ != pcVar2) {
      operator_delete((void *)local_b0._0_8_);
    }
  }
  local_b0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"net/proto2/public/generated_message_util.h","");
  DoIncludeFile(this,(string *)&local_b0,false,printer);
  if ((pointer)local_b0._0_8_ != pcVar2) {
    operator_delete((void *)local_b0._0_8_);
  }
  local_b0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"net/proto2/public/metadata_lite.h","");
  DoIncludeFile(this,(string *)&local_b0,false,printer);
  if ((pointer)local_b0._0_8_ != pcVar2) {
    operator_delete((void *)local_b0._0_8_);
  }
  FVar4 = GetOptimizeFor(this->file_,options,(bool *)0x0);
  if (FVar4 != FileOptions_OptimizeMode_LITE_RUNTIME) {
    local_b0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"net/proto2/public/generated_message_reflection.h","");
    DoIncludeFile(this,(string *)&local_b0,false,printer);
    if ((pointer)local_b0._0_8_ != pcVar2) {
      operator_delete((void *)local_b0._0_8_);
    }
  }
  if ((this->message_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->message_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    FVar4 = GetOptimizeFor(this->file_,options,(bool *)0x0);
    if (FVar4 == FileOptions_OptimizeMode_LITE_RUNTIME) {
      local_b0._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"net/proto2/public/message_lite.h","");
      DoIncludeFile(this,(string *)&local_b0,false,printer);
    }
    else {
      local_b0._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"net/proto2/public/message.h","");
      DoIncludeFile(this,(string *)&local_b0,false,printer);
    }
    if ((pointer)local_b0._0_8_ != pcVar2) {
      operator_delete((void *)local_b0._0_8_);
    }
  }
  if ((this->options_).opensource_runtime == true) {
    local_b0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"net/proto2/public/repeated_field.h","");
    DoIncludeFile(this,(string *)&local_b0,true,printer);
    if ((pointer)local_b0._0_8_ != pcVar2) {
      operator_delete((void *)local_b0._0_8_);
    }
    local_b0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"net/proto2/public/extension_set.h","");
    DoIncludeFile(this,(string *)&local_b0,true,printer);
    if ((pointer)local_b0._0_8_ != pcVar2) {
      operator_delete((void *)local_b0._0_8_);
    }
  }
  else {
    bVar3 = HasExtensionsOrExtendableMessage(this->file_);
    if (bVar3) {
      local_b0._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"net/proto2/public/extension_set.h","");
      DoIncludeFile(this,(string *)&local_b0,true,printer);
      if ((pointer)local_b0._0_8_ != pcVar2) {
        operator_delete((void *)local_b0._0_8_);
      }
    }
    bVar3 = HasRepeatedFields(this->file_);
    if (bVar3) {
      local_b0._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"net/proto2/public/repeated_field.h","");
      DoIncludeFile(this,(string *)&local_b0,true,printer);
      if ((pointer)local_b0._0_8_ != pcVar2) {
        operator_delete((void *)local_b0._0_8_);
      }
    }
    bVar3 = HasStringPieceFields(this->file_,options);
    if (bVar3) {
      local_b0._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"net/proto2/public/string_piece_field_support.h","");
      DoIncludeFile(this,(string *)&local_b0,false,printer);
      if ((pointer)local_b0._0_8_ != pcVar2) {
        operator_delete((void *)local_b0._0_8_);
      }
    }
    bVar3 = HasCordFields(this->file_,options);
    if (bVar3) {
      Formatter::operator()<>(&local_68,"#include \"third_party/absl/strings/cord.h\"\n");
    }
  }
  bVar3 = HasMapFields(this->file_);
  if (bVar3) {
    local_b0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"net/proto2/public/map.h","");
    DoIncludeFile(this,(string *)&local_b0,true,printer);
    if ((pointer)local_b0._0_8_ != pcVar2) {
      operator_delete((void *)local_b0._0_8_);
    }
    FVar4 = GetOptimizeFor(this->file_,options,(bool *)0x0);
    if (FVar4 == FileOptions_OptimizeMode_LITE_RUNTIME) {
      local_b0._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"net/proto2/public/map_entry_lite.h","");
      DoIncludeFile(this,(string *)&local_b0,false,printer);
      if ((pointer)local_b0._0_8_ != pcVar2) {
        operator_delete((void *)local_b0._0_8_);
      }
      local_b0._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"net/proto2/public/map_field_lite.h","");
      DoIncludeFile(this,(string *)&local_b0,false,printer);
    }
    else {
      local_b0._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"net/proto2/public/map_entry.h","");
      DoIncludeFile(this,(string *)&local_b0,false,printer);
      if ((pointer)local_b0._0_8_ != pcVar2) {
        operator_delete((void *)local_b0._0_8_);
      }
      local_b0._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"net/proto2/public/map_field_inl.h","");
      DoIncludeFile(this,(string *)&local_b0,false,printer);
    }
    if ((pointer)local_b0._0_8_ != pcVar2) {
      operator_delete((void *)local_b0._0_8_);
    }
  }
  bVar3 = HasEnumDefinitions(this->file_);
  if (bVar3) {
    FVar4 = GetOptimizeFor(this->file_,options,(bool *)0x0);
    if (FVar4 == FileOptions_OptimizeMode_LITE_RUNTIME) {
      local_b0._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"net/proto2/public/generated_enum_util.h","");
      DoIncludeFile(this,(string *)&local_b0,false,printer);
    }
    else {
      local_b0._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"net/proto2/public/generated_enum_reflection.h","");
      DoIncludeFile(this,(string *)&local_b0,false,printer);
    }
    if ((pointer)local_b0._0_8_ != pcVar2) {
      operator_delete((void *)local_b0._0_8_);
    }
  }
  pFVar1 = this->file_;
  if (0 < *(int *)(pFVar1 + 0x34)) {
    FVar4 = GetOptimizeFor(pFVar1,options,(bool *)0x0);
    if ((FVar4 != FileOptions_OptimizeMode_LITE_RUNTIME) &&
       (*(char *)(*(long *)(pFVar1 + 0x78) + 0x9b) == '\x01')) {
      local_b0._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"net/proto2/public/service.h","");
      DoIncludeFile(this,(string *)&local_b0,false,printer);
      if ((pointer)local_b0._0_8_ != pcVar2) {
        operator_delete((void *)local_b0._0_8_);
      }
    }
  }
  FVar4 = GetOptimizeFor(this->file_,options,(bool *)0x0);
  if ((FVar4 != FileOptions_OptimizeMode_LITE_RUNTIME) &&
     ((this->message_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->message_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    local_b0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"net/proto2/public/unknown_field_set.h","");
    DoIncludeFile(this,(string *)&local_b0,false,printer);
    if ((pointer)local_b0._0_8_ != pcVar2) {
      operator_delete((void *)local_b0._0_8_);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_68.vars_._M_t);
  return;
}

Assistant:

void FileGenerator::GenerateLibraryIncludes(io::Printer* printer) {
  Formatter format(printer, variables_);
  if (UsingImplicitWeakFields(file_, options_)) {
    IncludeFile("net/proto2/public/implicit_weak_message.h", printer);
  }
  if (HasWeakFields(file_, options_)) {
    GOOGLE_CHECK(!options_.opensource_runtime);
    IncludeFile("net/proto2/public/weak_field_map.h", printer);
  }
  if (HasLazyFields(file_, options_, &scc_analyzer_)) {
    GOOGLE_CHECK(!options_.opensource_runtime);
    IncludeFile("net/proto2/public/lazy_field.h", printer);
  }
  if (ShouldVerify(file_, options_, &scc_analyzer_)) {
    IncludeFile("net/proto2/public/wire_format_verify.h", printer);
  }

  if (options_.opensource_runtime) {
    // Verify the protobuf library header version is compatible with the protoc
    // version before going any further.
    IncludeFile("net/proto2/public/port_def.inc", printer);
    format(
        "#if PROTOBUF_VERSION < $1$\n"
        "#error This file was generated by a newer version of protoc which is\n"
        "#error incompatible with your Protocol Buffer headers. Please update\n"
        "#error your headers.\n"
        "#endif\n"
        "#if $2$ < PROTOBUF_MIN_PROTOC_VERSION\n"
        "#error This file was generated by an older version of protoc which "
        "is\n"
        "#error incompatible with your Protocol Buffer headers. Please\n"
        "#error regenerate this file with a newer version of protoc.\n"
        "#endif\n"
        "\n",
        PROTOBUF_MIN_HEADER_VERSION_FOR_PROTOC,  // 1
        PROTOBUF_VERSION);                       // 2
    IncludeFile("net/proto2/public/port_undef.inc", printer);
  }

  // OK, it's now safe to #include other files.
  IncludeFile("net/proto2/io/public/coded_stream.h", printer);
  IncludeFile("net/proto2/public/arena.h", printer);
  IncludeFile("net/proto2/public/arenastring.h", printer);
  if ((options_.force_inline_string || options_.profile_driven_inline_string) &&
      !options_.opensource_runtime) {
    IncludeFile("net/proto2/public/inlined_string_field.h", printer);
  }
  if (HasSimpleBaseClasses(file_, options_)) {
    IncludeFile("net/proto2/public/generated_message_bases.h", printer);
  }
  IncludeFile("net/proto2/public/generated_message_table_driven.h", printer);
  if (HasGeneratedMethods(file_, options_) &&
      options_.tctable_mode != Options::kTCTableNever) {
    IncludeFile("net/proto2/public/generated_message_tctable_decl.h", printer);
  }
  IncludeFile("net/proto2/public/generated_message_util.h", printer);
  IncludeFile("net/proto2/public/metadata_lite.h", printer);

  if (HasDescriptorMethods(file_, options_)) {
    IncludeFile("net/proto2/public/generated_message_reflection.h", printer);
  }

  if (!message_generators_.empty()) {
    if (HasDescriptorMethods(file_, options_)) {
      IncludeFile("net/proto2/public/message.h", printer);
    } else {
      IncludeFile("net/proto2/public/message_lite.h", printer);
    }
  }
  if (options_.opensource_runtime) {
    // Open-source relies on unconditional includes of these.
    IncludeFileAndExport("net/proto2/public/repeated_field.h", printer);
    IncludeFileAndExport("net/proto2/public/extension_set.h", printer);
  } else {
    // Google3 includes these files only when they are necessary.
    if (HasExtensionsOrExtendableMessage(file_)) {
      IncludeFileAndExport("net/proto2/public/extension_set.h", printer);
    }
    if (HasRepeatedFields(file_)) {
      IncludeFileAndExport("net/proto2/public/repeated_field.h", printer);
    }
    if (HasStringPieceFields(file_, options_)) {
      IncludeFile("net/proto2/public/string_piece_field_support.h", printer);
    }
    if (HasCordFields(file_, options_)) {
      format("#include \"third_party/absl/strings/cord.h\"\n");
    }
  }
  if (HasMapFields(file_)) {
    IncludeFileAndExport("net/proto2/public/map.h", printer);
    if (HasDescriptorMethods(file_, options_)) {
      IncludeFile("net/proto2/public/map_entry.h", printer);
      IncludeFile("net/proto2/public/map_field_inl.h", printer);
    } else {
      IncludeFile("net/proto2/public/map_entry_lite.h", printer);
      IncludeFile("net/proto2/public/map_field_lite.h", printer);
    }
  }

  if (HasEnumDefinitions(file_)) {
    if (HasDescriptorMethods(file_, options_)) {
      IncludeFile("net/proto2/public/generated_enum_reflection.h", printer);
    } else {
      IncludeFile("net/proto2/public/generated_enum_util.h", printer);
    }
  }

  if (HasGenericServices(file_, options_)) {
    IncludeFile("net/proto2/public/service.h", printer);
  }

  if (UseUnknownFieldSet(file_, options_) && !message_generators_.empty()) {
    IncludeFile("net/proto2/public/unknown_field_set.h", printer);
  }
}